

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsTaskExecutor.h
# Opt level: O2

void HighsTaskExecutor::initialize(int numThreads)

{
  long *plVar1;
  HighsTaskExecutor *this;
  
  plVar1 = (long *)globalExecutorHandle();
  if (*plVar1 == 0) {
    *(undefined1 *)(plVar1 + 1) = 1;
    this = (HighsTaskExecutor *)::highs::cache_aligned::alloc(0x48);
    HighsTaskExecutor(this,numThreads);
    *plVar1 = (long)this;
  }
  return;
}

Assistant:

static void initialize(int numThreads) {
    auto& executorHandle = threadLocalExecutorHandle();
    if (executorHandle.ptr == nullptr) {
      executorHandle.isMain = true;
      executorHandle.ptr = new (cache_aligned::alloc(sizeof(HighsTaskExecutor)))
          HighsTaskExecutor(numThreads);
    }
  }